

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_set.cpp
# Opt level: O2

unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>,_true> __thiscall
duckdb::Transformer::TransformResetVariable(Transformer *this,PGVariableSetStmt *stmt)

{
  NotImplementedException *this_00;
  long in_RDX;
  SetScope local_41;
  Transformer *local_40;
  string name;
  
  if (*(int *)(in_RDX + 8) != 0) {
    ::std::__cxx11::string::string((string *)&name,*(char **)(in_RDX + 0x10),(allocator *)&local_40)
    ;
    local_41 = anon_unknown_423::ToSetScope(*(VariableSetScope *)(in_RDX + 8));
    make_uniq<duckdb::ResetVariableStatement,std::__cxx11::string&,duckdb::SetScope>
              ((duckdb *)&local_40,&name,&local_41);
    (this->parent).ptr = local_40;
    ::std::__cxx11::string::~string((string *)&name);
    return (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)
           (unique_ptr<duckdb::SetStatement,_std::default_delete<duckdb::SetStatement>_>)this;
  }
  this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&name,"RESET LOCAL is not implemented.",(allocator *)&local_40);
  NotImplementedException::NotImplementedException(this_00,(string *)&name);
  __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<SetStatement> Transformer::TransformResetVariable(duckdb_libpgquery::PGVariableSetStmt &stmt) {
	D_ASSERT(stmt.kind == duckdb_libpgquery::VariableSetKind::VAR_RESET);

	if (stmt.scope == duckdb_libpgquery::VariableSetScope::VAR_SET_SCOPE_LOCAL) {
		throw NotImplementedException("RESET LOCAL is not implemented.");
	}

	string name(stmt.name);
	D_ASSERT(!name.empty()); // parser protect us!

	return make_uniq<ResetVariableStatement>(name, ToSetScope(stmt.scope));
}